

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gls::ContextArray::bind(ContextArray *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  InputType in_R8D;
  OutputType in_R9D;
  byte in_stack_00000008;
  int in_stack_00000010;
  bool normalized_local;
  OutputType outType_local;
  InputType inputType_local;
  int size_local;
  int offset_local;
  int attribNdx_local;
  ContextArray *this_local;
  
  this->m_attribNdx = __fd;
  this->m_bound = true;
  this->m_componentCount = __len;
  this->m_inputType = in_R8D;
  this->m_outputType = in_R9D;
  this->m_normalize = (bool)(in_stack_00000008 & 1);
  this->m_stride = in_stack_00000010;
  this->m_offset = (int)__addr;
  return (int)this;
}

Assistant:

void ContextArray::bind (int attribNdx, int offset, int size, InputType inputType, OutputType outType, bool normalized, int stride)
{
	m_attribNdx			= attribNdx;
	m_bound				= true;
	m_componentCount	= size;
	m_inputType			= inputType;
	m_outputType		= outType;
	m_normalize			= normalized;
	m_stride			= stride;
	m_offset			= offset;
}